

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

double __thiscall Imath_2_5::Matrix44<double>::determinant(Matrix44<double> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = this->x[0][3];
  dVar2 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = fastMinor(this,1,2,3,0,1,2);
    dVar2 = 0.0 - dVar1 * dVar2;
  }
  dVar1 = this->x[1][3];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar3 = fastMinor(this,0,2,3,0,1,2);
    dVar2 = dVar2 + dVar1 * dVar3;
  }
  dVar1 = this->x[2][3];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar3 = fastMinor(this,0,1,3,0,1,2);
    dVar2 = dVar2 - dVar1 * dVar3;
  }
  dVar1 = this->x[3][3];
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar3 = fastMinor(this,0,1,2,0,1,2);
    dVar2 = dVar3 * dVar1 + dVar2;
  }
  return dVar2;
}

Assistant:

inline T
Matrix44<T>::determinant () const
{
    T sum = (T)0;

    if (x[0][3] != 0.) sum -= x[0][3] * fastMinor(1,2,3,0,1,2);
    if (x[1][3] != 0.) sum += x[1][3] * fastMinor(0,2,3,0,1,2);
    if (x[2][3] != 0.) sum -= x[2][3] * fastMinor(0,1,3,0,1,2);
    if (x[3][3] != 0.) sum += x[3][3] * fastMinor(0,1,2,0,1,2);

    return sum;
}